

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  byte local_91;
  string local_70;
  byte local_49;
  string local_48;
  string *local_28;
  string *dir;
  uint i;
  bool first;
  ostringstream *w_local;
  cmOrderDirectoriesConstraint *this_local;
  
  dir._7_1_ = 1;
  _i = w;
  w_local = (ostringstream *)this;
  for (dir._0_4_ = 0; uVar6 = (ulong)(uint)dir,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->OD->OriginalDirectories), uVar6 < sVar4; dir._0_4_ = (uint)dir + 1) {
    local_28 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->OD->OriginalDirectories,(ulong)(uint)dir);
    bVar2 = std::operator!=(local_28,&this->Directory);
    local_49 = 0;
    bVar1 = false;
    local_91 = 0;
    if (bVar2) {
      cmsys::SystemTools::GetRealPath(&local_48,local_28,(string *)0x0);
      local_49 = 1;
      cmsys::SystemTools::GetRealPath(&local_70,&this->Directory,(string *)0x0);
      bVar1 = true;
      bVar2 = std::operator!=(&local_48,&local_70);
      local_91 = 0;
      if (bVar2) {
        iVar3 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,local_28);
        local_91 = (byte)iVar3;
      }
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((local_49 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_48);
    }
    if ((local_91 & 1) != 0) {
      if ((dir._7_1_ & 1) != 0) {
        dir._7_1_ = 0;
        std::operator<<((ostream *)_i,"  ");
        (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,_i);
        poVar5 = std::operator<<((ostream *)_i," in ");
        poVar5 = std::operator<<(poVar5,(string *)&this->Directory);
        std::operator<<(poVar5," may be hidden by files in:\n");
      }
      poVar5 = std::operator<<((ostream *)_i,"    ");
      poVar5 = std::operator<<(poVar5,(string *)local_28);
      std::operator<<(poVar5,"\n");
    }
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (unsigned int i = 0; i < this->OD->OriginalDirectories.size(); ++i) {
      // Check if this directory conflicts with the entry.
      std::string const& dir = this->OD->OriginalDirectories[i];
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }